

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int simpleNext(sqlite3_tokenizer_cursor *pCursor,char **ppToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  simple_tokenizer *t_00;
  sqlite3_tokenizer *psVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  sqlite3_tokenizer *psVar5;
  bool bVar6;
  uchar ch;
  char *pNew;
  int local_60;
  int n;
  int i;
  int iStartOffset;
  uchar *p;
  simple_tokenizer *t;
  simple_tokenizer_cursor *c;
  int *piPosition_local;
  int *piEndOffset_local;
  int *piStartOffset_local;
  int *pnBytes_local;
  char **ppToken_local;
  sqlite3_tokenizer_cursor *pCursor_local;
  
  t_00 = (simple_tokenizer *)pCursor->pTokenizer;
  psVar1 = pCursor[1].pTokenizer;
  do {
    if (*(int *)&pCursor[2].pTokenizer <= *(int *)((long)&pCursor[2].pTokenizer + 4)) {
      return 0x65;
    }
    while( true ) {
      bVar6 = false;
      if (*(int *)((long)&pCursor[2].pTokenizer + 4) < *(int *)&pCursor[2].pTokenizer) {
        iVar3 = simpleDelim(t_00,*(uchar *)((long)&psVar1->pModule +
                                           (long)*(int *)((long)&pCursor[2].pTokenizer + 4)));
        bVar6 = iVar3 != 0;
      }
      if (!bVar6) break;
      *(int *)((long)&pCursor[2].pTokenizer + 4) = *(int *)((long)&pCursor[2].pTokenizer + 4) + 1;
    }
    iVar3 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    while( true ) {
      bVar6 = false;
      if (*(int *)((long)&pCursor[2].pTokenizer + 4) < *(int *)&pCursor[2].pTokenizer) {
        iVar4 = simpleDelim(t_00,*(uchar *)((long)&psVar1->pModule +
                                           (long)*(int *)((long)&pCursor[2].pTokenizer + 4)));
        bVar6 = iVar4 == 0;
      }
      if (!bVar6) break;
      *(int *)((long)&pCursor[2].pTokenizer + 4) = *(int *)((long)&pCursor[2].pTokenizer + 4) + 1;
    }
  } while (*(int *)((long)&pCursor[2].pTokenizer + 4) <= iVar3);
  iVar4 = *(int *)((long)&pCursor[2].pTokenizer + 4) - iVar3;
  if (*(int *)&pCursor[5].pTokenizer < iVar4) {
    *(int *)&pCursor[5].pTokenizer = iVar4 + 0x14;
    psVar5 = (sqlite3_tokenizer *)
             sqlite3_realloc(pCursor[4].pTokenizer,*(int *)&pCursor[5].pTokenizer);
    if (psVar5 == (sqlite3_tokenizer *)0x0) {
      return 7;
    }
    pCursor[4].pTokenizer = psVar5;
  }
  for (local_60 = 0; local_60 < iVar4; local_60 = local_60 + 1) {
    bVar2 = *(byte *)((long)&psVar1->pModule + (long)(iVar3 + local_60));
    if ((0x40 < bVar2) && (bVar2 < 0x5b)) {
      bVar2 = bVar2 + 0x20;
    }
    *(byte *)((long)&(pCursor[4].pTokenizer)->pModule + (long)local_60) = bVar2;
  }
  *ppToken = (char *)pCursor[4].pTokenizer;
  *pnBytes = iVar4;
  *piStartOffset = iVar3;
  *piEndOffset = *(int *)((long)&pCursor[2].pTokenizer + 4);
  iVar3 = *(int *)&pCursor[3].pTokenizer;
  *(int *)&pCursor[3].pTokenizer = iVar3 + 1;
  *piPosition = iVar3;
  return 0;
}

Assistant:

static int simpleNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by simpleOpen */
  const char **ppToken,               /* OUT: *ppToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  simple_tokenizer_cursor *c = (simple_tokenizer_cursor *) pCursor;
  simple_tokenizer *t = (simple_tokenizer *) pCursor->pTokenizer;
  unsigned char *p = (unsigned char *)c->pInput;

  while( c->iOffset<c->nBytes ){
    int iStartOffset;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nBytes && simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nBytes && !simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int i, n = c->iOffset-iStartOffset;
      if( n>c->nTokenAllocated ){
        char *pNew;
        c->nTokenAllocated = n+20;
        pNew = sqlite3_realloc(c->pToken, c->nTokenAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->pToken = pNew;
      }
      for(i=0; i<n; i++){
        /* TODO(shess) This needs expansion to handle UTF-8
        ** case-insensitivity.
        */
        unsigned char ch = p[iStartOffset+i];
        c->pToken[i] = (char)((ch>='A' && ch<='Z') ? ch-'A'+'a' : ch);
      }
      *ppToken = c->pToken;
      *pnBytes = n;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;

      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}